

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O0

void Sfm_LibCellProfile(Mio_Cell2_t *pCellBot,Mio_Cell2_t *pCellTop,int InTop,int nFanins,int *Perm,
                       int *pProf)

{
  int local_34;
  int DelayAdd;
  int i;
  int *pProf_local;
  int *Perm_local;
  int nFanins_local;
  int InTop_local;
  Mio_Cell2_t *pCellTop_local;
  Mio_Cell2_t *pCellBot_local;
  
  for (local_34 = 0; local_34 < nFanins; local_34 = local_34 + 1) {
    if (Perm[local_34] < (int)(*(uint *)&pCellBot->field_0x10 >> 0x1c)) {
      pProf[local_34] = (pCellTop != (Mio_Cell2_t *)0x0) + 1;
    }
    else if (Perm[local_34] < (int)((*(uint *)&pCellBot->field_0x10 >> 0x1c) + InTop)) {
      pProf[local_34] = 1;
    }
    else {
      pProf[local_34] = 1;
    }
  }
  return;
}

Assistant:

void Sfm_LibCellProfile( Mio_Cell2_t * pCellBot, Mio_Cell2_t * pCellTop, int InTop, int nFanins, int * Perm, int * pProf )
{
    int i, DelayAdd = pCellTop ? 1 : 0;
    for ( i = 0; i < nFanins; i++ )
        if ( Perm[i] < (int)pCellBot->nFanins )
            pProf[i] = 1 + DelayAdd;
        else if ( Perm[i] < (int)pCellBot->nFanins + InTop )
            pProf[i] = 1;
        else // if ( Perm[i] >= (int)pCellBot->nFanins + InTop )
            pProf[i] = 1;
}